

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::invalid_option_format_error::~invalid_option_format_error
          (invalid_option_format_error *this)

{
  OptionException::~OptionException((OptionException *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

invalid_option_format_error(const std::string& format)
    : OptionSpecException("Invalid option format " + LQUOTE + format + RQUOTE)
    {
    }